

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

FillerParameter * __thiscall caffe::V0LayerParameter::mutable_weight_filler(V0LayerParameter *this)

{
  FillerParameter *this_00;
  V0LayerParameter *this_local;
  
  set_has_weight_filler(this);
  if (this->weight_filler_ == (FillerParameter *)0x0) {
    this_00 = (FillerParameter *)operator_new(0x40);
    FillerParameter::FillerParameter(this_00);
    this->weight_filler_ = this_00;
  }
  return this->weight_filler_;
}

Assistant:

inline ::caffe::FillerParameter* V0LayerParameter::mutable_weight_filler() {
  set_has_weight_filler();
  if (weight_filler_ == NULL) {
    weight_filler_ = new ::caffe::FillerParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.V0LayerParameter.weight_filler)
  return weight_filler_;
}